

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

bool libcellml::reachableEquivalence(VariablePtr *variable1,VariablePtr *variable2)

{
  bool bVar1;
  bool bVar2;
  ParentedEntityPtr parent2;
  ParentedEntityPtr parent1;
  ParentedEntity PStack_28;
  ParentedEntity local_18;
  
  ParentedEntity::parent(&local_18);
  ParentedEntity::parent(&PStack_28);
  bVar1 = isEntityChildOf((ParentedEntityPtr *)&local_18,(ParentedEntityPtr *)&PStack_28);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = isEntityChildOf((ParentedEntityPtr *)&PStack_28,(ParentedEntityPtr *)&local_18);
    if (!bVar1) {
      bVar2 = areEntitiesSiblings((ParentedEntityPtr *)&local_18,(ParentedEntityPtr *)&PStack_28);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_28.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_28.super_Entity.mPimpl);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18.super_Entity.mPimpl);
  }
  return bVar2;
}

Assistant:

bool reachableEquivalence(const VariablePtr &variable1, const VariablePtr &variable2)
{
    auto parent1 = variable1->parent();
    auto parent2 = variable2->parent();

    return isEntityChildOf(parent1, parent2)
           || isEntityChildOf(parent2, parent1)
           || areEntitiesSiblings(parent1, parent2);
}